

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_progress_reporter.cpp
# Opt level: O1

void ON_ProgressReporter::ReportProgress
               (ON_ProgressReporter *progress_reporter,double fraction_complete)

{
  double dVar1;
  
  if (progress_reporter == (ON_ProgressReporter *)0x0) {
    return;
  }
  if (fraction_complete <= progress_reporter->m_fraction_complete) {
    if (-1.0 < progress_reporter->m_previous_callback_fraction_complete) {
      return;
    }
    if (fraction_complete <= progress_reporter->m_fraction_complete) goto LAB_0059ee6b;
  }
  if (1.0 <= fraction_complete) {
    fraction_complete = 1.0;
  }
  progress_reporter->m_fraction_complete = fraction_complete;
LAB_0059ee6b:
  if (progress_reporter->m_callback_function != (_func_void_ON__UINT_PTR_double *)0x0) {
    dVar1 = progress_reporter->m_fraction_complete;
    if ((progress_reporter->m_previous_callback_fraction_complete + 0.0009765625 <= dVar1) ||
       (((dVar1 == 1.0 && (!NAN(dVar1))) &&
        (progress_reporter->m_previous_callback_fraction_complete < 1.0)))) {
      (*progress_reporter->m_callback_function)(progress_reporter->m_callback_context,dVar1);
      progress_reporter->m_previous_callback_fraction_complete =
           progress_reporter->m_fraction_complete;
    }
  }
  return;
}

Assistant:

void ON_ProgressReporter::ReportProgress( 
  ON_ProgressReporter* progress_reporter,
  double fraction_complete
  )
{
  if ( 0 != progress_reporter )
  {
    if (    fraction_complete > progress_reporter->m_fraction_complete 
         || progress_reporter->m_previous_callback_fraction_complete <= -1.0 
       )
    {
      if ( fraction_complete > progress_reporter->m_fraction_complete )
      {
        progress_reporter->m_fraction_complete = (fraction_complete < 1.0) ? fraction_complete : 1.0;
      }

      if ( 0 != progress_reporter->m_callback_function )
      {
        // callback at most 1026 times
        const double max_callback_count = 1024.0;
        if (    (progress_reporter->m_fraction_complete >= progress_reporter->m_previous_callback_fraction_complete + 1.0/max_callback_count )
             || (1.0 == progress_reporter->m_fraction_complete && progress_reporter->m_previous_callback_fraction_complete < 1.0)
           )
        {
          progress_reporter->m_callback_function(progress_reporter->m_callback_context,progress_reporter->m_fraction_complete);
          progress_reporter->m_previous_callback_fraction_complete = progress_reporter->m_fraction_complete;
        }
      }
    }
  }
}